

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

MemberSyntax * __thiscall
slang::parsing::Parser::parseClockingDeclaration(Parser *this,AttrList attributes)

{
  SyntaxNode *pSVar1;
  Token edge;
  Token name;
  Token at;
  Token semi;
  Token defaultKeyword;
  bool bVar2;
  bool bVar3;
  int iVar4;
  DefaultClockingReferenceSyntax *pDVar5;
  SourceLocation SVar6;
  NameSyntax *expr;
  Diagnostic *this_00;
  undefined4 extraout_var;
  NamedBlockClauseSyntax *endBlock;
  ClockingDeclarationSyntax *pCVar7;
  __extent_storage<18446744073709551615UL> _Var8;
  long extraout_RDX;
  BumpAllocator *pBVar9;
  byte bVar10;
  Token *this_01;
  bool bVar11;
  string_view sVar12;
  Token TVar13;
  SourceRange range;
  Token local_1b0;
  Token local_1a0;
  SignalEventExpressionSyntax *local_190;
  pointer local_188;
  Token local_180;
  MemberSyntax *member;
  Info *local_168;
  undefined8 local_160;
  Info *local_158;
  undefined8 local_150;
  size_t local_148;
  Token *local_140;
  Token *local_138;
  Token endClocking;
  SyntaxList<slang::syntax::MemberSyntax> local_120;
  undefined8 local_e8;
  Info *pIStack_e0;
  undefined8 local_d8;
  Info *pIStack_d0;
  Token local_c8;
  Token local_b8;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  Token local_50;
  Token local_40;
  
  _Var8 = attributes._M_extent._M_extent_value;
  local_188 = attributes._M_ptr;
  Token::Token(&local_1a0);
  bVar2 = ParserBase::peek(&this->super_ParserBase,ClockingKeyword);
  if (!bVar2) {
    local_1a0 = ParserBase::consume(&this->super_ParserBase);
  }
  local_180 = ParserBase::expect(&this->super_ParserBase,ClockingKeyword);
  local_1b0 = ParserBase::consumeIf(&this->super_ParserBase,Identifier);
  if (local_1a0.kind == DefaultKeyword) {
    if (local_1b0.info != (Info *)0x0) {
      bVar2 = ParserBase::peek(&this->super_ParserBase,Semicolon);
      defaultKeyword = local_1a0;
      TVar13 = local_1b0;
      if (bVar2) {
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len._0_4_ = 1;
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 0;
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[0] = '\0';
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[1] = '\0';
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[2] = '\0';
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[3] = '\0';
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[4] = '\0';
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[5] = '\0';
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[6] = '\0';
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[7] = '\0';
        members.stackBase._8_8_ = local_188;
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
             (pointer)&PTR_getChild_00678c10;
        local_b8.kind = local_1b0.kind;
        local_b8._2_1_ = local_1b0._2_1_;
        local_b8.numFlags.raw = local_1b0.numFlags.raw;
        local_b8.rawLen = local_1b0.rawLen;
        local_b8.info = local_1b0.info;
        local_1b0 = TVar13;
        members.stackBase._0_8_ = _Var8._M_extent_value;
        members.stackBase._16_8_ = _Var8._M_extent_value;
        local_c8 = ParserBase::consume(&this->super_ParserBase);
        name.info = local_b8.info;
        name.kind = local_b8.kind;
        name._2_1_ = local_b8._2_1_;
        name.numFlags.raw = local_b8.numFlags.raw;
        name.rawLen = local_b8.rawLen;
        pDVar5 = slang::syntax::SyntaxFactory::defaultClockingReference
                           (&this->factory,
                            (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members,
                            defaultKeyword,local_180,name,local_c8);
        return &pDVar5->super_MemberSyntax;
      }
      goto LAB_003dbbcd;
    }
  }
  else {
LAB_003dbbcd:
    if (local_1b0.info != (Info *)0x0) goto LAB_003dbc09;
  }
  pBVar9 = (this->super_ParserBase).alloc;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>._0_16_ =
       ParserBase::peek(&this->super_ParserBase);
  SVar6 = Token::location((Token *)&members);
  local_1b0 = Token::createMissing(pBVar9,Identifier,SVar6);
LAB_003dbc09:
  if ((local_1a0.info == (Info *)0x0) && (sVar12 = Token::valueText(&local_1b0), sVar12._M_len == 0)
     ) {
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>._0_16_ =
         ParserBase::peek(&this->super_ParserBase);
    SVar6 = Token::location((Token *)&members);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x90005,SVar6);
  }
  TVar13 = ParserBase::expect(&this->super_ParserBase,At);
  local_158 = TVar13.info;
  local_150 = TVar13._0_8_;
  bVar2 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  local_148 = _Var8._M_extent_value;
  if (bVar2) {
    local_190 = (SignalEventExpressionSyntax *)parseEventExpression(this);
  }
  else {
    bVar2 = ParserBase::peek(&this->super_ParserBase,SystemIdentifier);
    if (bVar2) {
      this_01 = &local_40;
      Token::Token(this_01);
      expr = (NameSyntax *)
             parsePrimaryExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
    }
    else {
      this_01 = &local_50;
      Token::Token(this_01);
      expr = parseName(this);
    }
    edge.kind = this_01->kind;
    edge._2_1_ = this_01->field_0x2;
    edge.numFlags.raw = (this_01->numFlags).raw;
    edge.rawLen = this_01->rawLen;
    edge.info = this_01->info;
    local_190 = slang::syntax::SyntaxFactory::signalEventExpression
                          (&this->factory,edge,&expr->super_ExpressionSyntax,
                           (IffEventClauseSyntax *)0x0);
  }
  TVar13 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  local_168 = TVar13.info;
  local_160 = TVar13._0_8_;
  Token::Token(&endClocking);
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
       (pointer)members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 8;
  local_138 = &(this->super_ParserBase).lastPoppedDelims.first;
  local_140 = &(this->super_ParserBase).lastPoppedDelims.second;
  bVar2 = false;
  while( true ) {
    TVar13 = ParserBase::peek(&this->super_ParserBase);
    if ((TVar13.kind == EndOfFile) || ((TVar13._0_4_ & 0xffff) == 0x92)) break;
    member = parseClockingItem(this);
    bVar11 = member == (MemberSyntax *)0x0;
    if (bVar11) {
      bVar3 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar13.kind);
      if (bVar3) {
        local_120.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        range = Token::range((Token *)&local_120);
        this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
        local_120.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        sVar12 = Token::valueText((Token *)&local_120);
        Diagnostic::operator<<(this_00,sVar12);
        bVar10 = 0;
        if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
           ((this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
          SVar6 = Token::location(local_138);
          Diagnostic::addNote(this_00,(DiagCode)0xc10005,SVar6);
          SVar6 = Token::location(local_140);
          Diagnostic::addNote(this_00,(DiagCode)0xc00005,SVar6);
          bVar10 = 0;
        }
      }
      else {
        bVar10 = ~bVar2 & 1;
      }
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)bVar10 << 0x20 | 0x450005));
      bVar2 = bVar11;
    }
    else {
      SmallVectorBase<slang::syntax::MemberSyntax*>::
      emplace_back<slang::syntax::MemberSyntax*const&>
                ((SmallVectorBase<slang::syntax::MemberSyntax*> *)&members,&member);
      pSVar1 = this->previewNode;
      this->previewNode = (SyntaxNode *)0x0;
      (member->super_SyntaxNode).previewNode = pSVar1;
      bVar2 = bVar11;
    }
  }
  endClocking = ParserBase::expect(&this->super_ParserBase,EndClockingKeyword);
  pBVar9 = (this->super_ParserBase).alloc;
  iVar4 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                    (&members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>,
                     (EVP_PKEY_CTX *)pBVar9,(EVP_PKEY_CTX *)endClocking.info);
  SmallVectorBase<slang::syntax::MemberSyntax_*>::cleanup
            (&members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>,(EVP_PKEY_CTX *)pBVar9);
  if (extraout_RDX != 0 && local_1a0.kind == GlobalKeyword) {
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>._0_16_ =
         slang::syntax::SyntaxNode::getFirstToken
                   (&(*(pointer)CONCAT44(extraout_var,iVar4))->super_SyntaxNode);
    SVar6 = Token::location((Token *)&members);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x5d0005,SVar6);
  }
  endBlock = parseNamedBlockClause(this);
  checkBlockNames(this,local_1b0,endBlock);
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len._0_4_ = 1;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 0;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[0] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[1] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[2] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[3] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[4] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[5] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[6] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[7] = '\0';
  members.stackBase[0] = (undefined1)local_148;
  members.stackBase[1] = local_148._1_1_;
  members.stackBase[2] = local_148._2_1_;
  members.stackBase[3] = local_148._3_1_;
  members.stackBase[4] = local_148._4_1_;
  members.stackBase[5] = local_148._5_1_;
  members.stackBase[6] = local_148._6_1_;
  members.stackBase[7] = local_148._7_1_;
  members.stackBase._8_8_ = local_188;
  members.stackBase[0x10] = (undefined1)local_148;
  members.stackBase[0x11] = local_148._1_1_;
  members.stackBase[0x12] = local_148._2_1_;
  members.stackBase[0x13] = local_148._3_1_;
  members.stackBase[0x14] = local_148._4_1_;
  members.stackBase[0x15] = local_148._5_1_;
  members.stackBase[0x16] = local_148._6_1_;
  members.stackBase[0x17] = local_148._7_1_;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
       (pointer)&PTR_getChild_00678c10;
  local_d8 = local_150;
  pIStack_d0 = local_158;
  local_e8 = local_160;
  pIStack_e0 = local_168;
  local_120.super_SyntaxListBase.super_SyntaxNode.kind = 1;
  local_120.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_120.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_120.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00678d00;
  at.info = local_158;
  at.kind = (undefined2)local_150;
  at._2_1_ = local_150._2_1_;
  at.numFlags.raw = local_150._3_1_;
  at.rawLen = local_150._4_4_;
  semi.info = local_168;
  semi.kind = (undefined2)local_160;
  semi._2_1_ = local_160._2_1_;
  semi.numFlags.raw = local_160._3_1_;
  semi.rawLen = local_160._4_4_;
  local_120.super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)CONCAT44(extraout_var,iVar4);
  pCVar7 = slang::syntax::SyntaxFactory::clockingDeclaration
                     (&this->factory,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members,
                      local_1a0,local_180,local_1b0,at,&local_190->super_EventExpressionSyntax,semi,
                      &local_120,endClocking,endBlock);
  return &pCVar7->super_MemberSyntax;
}

Assistant:

MemberSyntax& Parser::parseClockingDeclaration(AttrList attributes) {
    Token globalOrDefault;
    if (!peek(TokenKind::ClockingKeyword))
        globalOrDefault = consume();

    Token clocking = expect(TokenKind::ClockingKeyword);
    Token blockName = consumeIf(TokenKind::Identifier);

    // If this is a default reference there is no body to parse.
    if (globalOrDefault.kind == TokenKind::DefaultKeyword && blockName &&
        peek(TokenKind::Semicolon)) {
        return factory.defaultClockingReference(attributes, globalOrDefault, clocking, blockName,
                                                consume());
    }

    if (!blockName)
        blockName = Token::createMissing(alloc, TokenKind::Identifier, peek().location());

    if (!globalOrDefault && blockName.valueText().empty())
        addDiag(diag::ClockingNameEmpty, peek().location());

    Token at = expect(TokenKind::At);

    EventExpressionSyntax* event;
    if (peek(TokenKind::OpenParenthesis)) {
        event = &parseEventExpression();
    }
    else if (peek(TokenKind::SystemIdentifier)) {
        event = &factory.signalEventExpression({}, parsePrimaryExpression(ExpressionOptions::None),
                                               nullptr);
    }
    else {
        event = &factory.signalEventExpression({}, parseName(), nullptr);
    }

    Token semi = expect(TokenKind::Semicolon);
    Token endClocking;
    auto members = parseMemberList<MemberSyntax>(
        TokenKind::EndClockingKeyword, endClocking, SyntaxKind::ClockingDeclaration,
        [this](SyntaxKind, bool&) { return parseClockingItem(); });

    if (globalOrDefault.kind == TokenKind::GlobalKeyword && !members.empty())
        addDiag(diag::GlobalClockingEmpty, members[0]->getFirstToken().location());

    NamedBlockClauseSyntax* endBlockName = parseNamedBlockClause();
    checkBlockNames(blockName, endBlockName);

    return factory.clockingDeclaration(attributes, globalOrDefault, clocking, blockName, at, *event,
                                       semi, members, endClocking, endBlockName);
}